

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ext_loader_impl.cpp
# Opt level: O0

int ext_loader_impl_destroy(loader_impl impl)

{
  bool bVar1;
  undefined8 uVar2;
  undefined8 in_RDI;
  pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_loader_impl_ext_handle_lib_type>
  iterator;
  iterator __end3;
  iterator __begin3;
  map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_loader_impl_ext_handle_lib_type,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_loader_impl_ext_handle_lib_type>_>_>
  *__range3;
  loader_impl_ext ext_impl;
  map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_loader_impl_ext_handle_lib_type,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_loader_impl_ext_handle_lib_type>_>_>
  *in_stack_ffffffffffffff58;
  loader_impl_ext_type *in_stack_ffffffffffffff60;
  pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_loader_impl_ext_handle_lib_type>
  *in_stack_ffffffffffffff68;
  void *pvVar3;
  pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_loader_impl_ext_handle_lib_type>
  *in_stack_ffffffffffffff70;
  loader_impl_ext_type *local_40;
  _Self local_30;
  _Self local_28;
  long local_20;
  void *local_18;
  undefined8 local_10;
  int local_4;
  
  local_10 = in_RDI;
  local_18 = (void *)loader_impl_get(in_RDI);
  if (local_18 == (void *)0x0) {
    local_4 = 1;
  }
  else {
    loader_unload_children(local_10);
    bVar1 = std::
            map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_loader_impl_ext_handle_lib_type,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_loader_impl_ext_handle_lib_type>_>_>
            ::empty((map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_loader_impl_ext_handle_lib_type,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_loader_impl_ext_handle_lib_type>_>_>
                     *)0x109c51);
    if (!bVar1) {
      local_20 = (long)local_18 + 0x30;
      local_28._M_node =
           (_Base_ptr)
           std::
           map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_loader_impl_ext_handle_lib_type,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_loader_impl_ext_handle_lib_type>_>_>
           ::begin(in_stack_ffffffffffffff58);
      local_30._M_node =
           (_Base_ptr)
           std::
           map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_loader_impl_ext_handle_lib_type,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_loader_impl_ext_handle_lib_type>_>_>
           ::end(in_stack_ffffffffffffff58);
      while (bVar1 = std::operator!=(&local_28,&local_30), bVar1) {
        std::
        _Rb_tree_iterator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_loader_impl_ext_handle_lib_type>_>
        ::operator*((_Rb_tree_iterator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_loader_impl_ext_handle_lib_type>_>
                     *)0x109cbc);
        std::
        pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_loader_impl_ext_handle_lib_type>
        ::pair(in_stack_ffffffffffffff70,in_stack_ffffffffffffff68);
        uVar2 = std::__cxx11::string::c_str();
        in_stack_ffffffffffffff60 = local_40;
        log_write_impl_va("metacall",0x17c,"ext_loader_impl_destroy",
                          "/workspace/llm4binary/github/license_c_cmakelists/metacall[P]core/source/loaders/ext_loader/source/ext_loader_impl.cpp"
                          ,0,"Unloading handle: %s <%p>",uVar2);
        dynlink_unload(local_40);
        std::
        pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_loader_impl_ext_handle_lib_type>
        ::~pair((pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_loader_impl_ext_handle_lib_type>
                 *)in_stack_ffffffffffffff60);
        std::
        _Rb_tree_iterator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_loader_impl_ext_handle_lib_type>_>
        ::operator++((_Rb_tree_iterator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_loader_impl_ext_handle_lib_type>_>
                      *)in_stack_ffffffffffffff60);
      }
    }
    if (local_18 != (void *)0x0) {
      pvVar3 = local_18;
      loader_impl_ext_type::~loader_impl_ext_type(in_stack_ffffffffffffff60);
      operator_delete(pvVar3,0x60);
    }
    local_4 = 0;
  }
  return local_4;
}

Assistant:

int ext_loader_impl_destroy(loader_impl impl)
{
	loader_impl_ext ext_impl = static_cast<loader_impl_ext>(loader_impl_get(impl));

	if (ext_impl != NULL)
	{
		/* Destroy children loaders */
		loader_unload_children(impl);

		/* Destroy all handles */
		if (!ext_impl->destroy_list.empty())
		{
			for (auto iterator : ext_impl->destroy_list)
			{
				log_write("metacall", LOG_LEVEL_DEBUG, "Unloading handle: %s <%p>", iterator.second.name.c_str(), iterator.second.handle);
				dynlink_unload(iterator.second.handle);
			}
		}

		delete ext_impl;

		return 0;
	}

	return 1;
}